

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateParallel::ArchiveIN(ChLinkMateParallel *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMateParallel>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  local_28._value = &this->flipped;
  local_28._name = "flipped";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMateParallel::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMateParallel>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(flipped);
}